

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall MxxColl_All2allvUnknownSize_Test::TestBody(MxxColl_All2allvUnknownSize_Test *this)

{
  pointer *this_00;
  undefined1 *this_01;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  iterator __first;
  char *pcVar6;
  reference actual;
  AssertHelper local_160;
  Message local_158;
  char local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  size_t j_1;
  iterator iStack_128;
  int i_1;
  iterator it;
  AssertHelper local_118;
  Message local_110;
  size_type local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  unsigned_long local_e0;
  size_t recv_size;
  undefined1 local_b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> actual_recv_count;
  vector<char,_std::allocator<char>_> result;
  ulong local_80;
  size_t j;
  undefined1 local_70 [4];
  int i;
  vector<char,_std::allocator<char>_> msgs;
  undefined1 local_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  comm c;
  MxxColl_All2allvUnknownSize_Test *this_local;
  
  this_00 = &send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  mxx::comm::comm((comm *)this_00);
  iVar3 = mxx::comm::size((comm *)this_00);
  this_01 = &msgs.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x13;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)this_01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,(long)iVar3,
             (allocator_type *)this_01);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             &msgs.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x13);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_70);
  for (j._4_4_ = 0;
      iVar3 = mxx::comm::size((comm *)&send_counts.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage),
      j._4_4_ < iVar3; j._4_4_ = j._4_4_ + 1) {
    iVar3 = mxx::comm::rank((comm *)&send_counts.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar4 = mxx::comm::size((comm *)&send_counts.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
                        (long)j._4_4_);
    *pvVar5 = (long)((j._4_4_ + iVar3) % iVar4 + 3);
    for (local_80 = 0;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
                            (long)j._4_4_), local_80 < *pvVar5; local_80 = local_80 + 1) {
      iVar3 = mxx::comm::rank((comm *)&send_counts.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      result.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ =
           (char)j._4_4_ + 'A' + (char)local_80 + (char)iVar3;
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)local_70,
                 &result.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
    }
  }
  mxx::all2allv<char>((vector<char,_std::allocator<char>_> *)
                      &actual_recv_count.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (vector<char,_std::allocator<char>_> *)local_70,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
                      (comm *)&send_counts.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  mxx::comm::comm((comm *)&recv_size);
  mxx::all2all<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,(comm *)&recv_size);
  mxx::comm::~comm((comm *)&recv_size);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
  iVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )gtest_ar.message_.ptr_,0);
  local_e0 = (unsigned_long)iVar3;
  local_108 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)
                         &actual_recv_count.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_100,"recv_size","result.size()",&local_e0,&local_108);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(&local_110);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
               ,0x296,pcVar6);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  it._M_current._5_3_ = 0;
  it._M_current._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  if (it._M_current._4_4_ == 0) {
    iStack_128 = std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)
                            &actual_recv_count.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    for (j_1._4_4_ = 0;
        iVar3 = mxx::comm::size((comm *)&send_counts.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage),
        j_1._4_4_ < iVar3; j_1._4_4_ = j_1._4_4_ + 1) {
      for (gtest_ar_1.message_.ptr_ =
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          sVar1.ptr_ = gtest_ar_1.message_.ptr_,
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,
                              (long)j_1._4_4_),
          sVar1.ptr_ < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pvVar5;
          gtest_ar_1.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(gtest_ar_1.message_.ptr_)->field_0x1) {
        iVar3 = mxx::comm::rank((comm *)&send_counts.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_149 = (char)j_1._4_4_ + 'A' + (char)iVar3 + (char)gtest_ar_1.message_.ptr_;
        actual = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&stack0xfffffffffffffed8);
        testing::internal::EqHelper<false>::Compare<char,char>
                  ((EqHelper<false> *)local_148,"(char)(\'A\'+i+c.rank()+j)","*it",&local_149,actual
                  );
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
        if (!bVar2) {
          testing::Message::Message(&local_158);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
          testing::internal::AssertHelper::AssertHelper
                    (&local_160,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                     ,0x29a,pcVar6);
          testing::internal::AssertHelper::operator=(&local_160,&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_160);
          testing::Message::~Message(&local_158);
        }
        it._M_current._5_3_ = 0;
        it._M_current._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
        if (it._M_current._4_4_ != 0) goto LAB_001b5b27;
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&stack0xfffffffffffffed8,0);
      }
    }
    it._M_current._4_4_ = 0;
  }
LAB_001b5b27:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             &actual_recv_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_70)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  mxx::comm::~comm((comm *)&send_counts.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(MxxColl, All2allvUnknownSize) {
    mxx::comm c;

    std::vector<size_t> send_counts(c.size());
    std::vector<char> msgs;
    for (int i = 0; i < c.size(); ++i) {
        send_counts[i] = (i + c.rank()) % c.size() + 3;
        for (size_t j = 0; j < send_counts[i]; ++j) {
            msgs.push_back('A'+i+j+c.rank());
        }
    }

    // send without knowing the receive count
    std::vector<char> result = mxx::all2allv(msgs, send_counts, c);

    // get the expected receive counts
    std::vector<size_t> actual_recv_count = mxx::all2all(send_counts);
    size_t recv_size = std::accumulate(actual_recv_count.begin(), actual_recv_count.end(), 0);

    ASSERT_EQ(recv_size, result.size());
    std::vector<char>::iterator it = result.begin();
    for (int i = 0; i < c.size(); ++i) {
        for (size_t j = 0; j < actual_recv_count[i]; ++j) {
            ASSERT_EQ((char)('A'+i+c.rank()+j), *it);
            it++;
        }
    }
}